

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  RawBrandedSchema *pRVar2;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  ulong uVar4;
  uint64_t id;
  ulong uVar5;
  Maybe<capnp::InterfaceSchema> MVar6;
  Reader superclass;
  Reader superclasses;
  Schema local_c8;
  Schema local_c0;
  StructReader local_b8;
  PointerReader local_88;
  ListReader local_68;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar3;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  if (uVar1 < 0x40) {
    pRVar2 = *(RawBrandedSchema **)typeId;
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
    if ((uint *)pRVar2->generic->id == counter) {
LAB_001d369e:
      *(undefined1 *)&(this->super_Schema).raw = 1;
      this[1].super_Schema.raw = pRVar2;
    }
    else {
      local_68.ptr = (byte *)pRVar2->generic->encodedNode;
      local_68.segment = (SegmentReader *)0x0;
      local_68.capTable = (CapTableReader *)0x0;
      local_68.elementCount = 0x7fffffff;
      _::PointerReader::getStruct(&local_b8,(PointerReader *)&local_68,(word *)0x0);
      local_88.pointer = local_b8.pointers + 4;
      if (local_b8.pointerCount < 5) {
        local_b8.segment._0_4_ = 0;
        local_b8.segment._4_4_ = 0;
        local_b8.capTable._0_4_ = 0;
        local_b8.capTable._4_4_ = 0;
        local_b8.nestingLimit = 0x7fffffff;
        local_88.pointer = (WirePointer *)0x0;
      }
      local_88.segment._0_4_ = local_b8.segment._0_4_;
      local_88.segment._4_4_ = local_b8.segment._4_4_;
      local_88.capTable._0_4_ = local_b8.capTable._0_4_;
      local_88.capTable._4_4_ = local_b8.capTable._4_4_;
      local_88.nestingLimit = local_b8.nestingLimit;
      _::PointerReader::getList(&local_68,&local_88,INLINE_COMPOSITE,(word *)0x0);
      uVar4 = (ulong)local_68.elementCount;
      aVar3 = extraout_RDX;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          _::ListReader::getStructElement(&local_b8,&local_68,(ElementCount)uVar5);
          if (local_b8.dataSize < 0x40) {
            id = 0;
          }
          else {
            id = *local_b8.data;
          }
          local_c8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar5 | 0x4000000);
          local_c0.raw = (RawBrandedSchema *)Schema::asInterface(&local_c8);
          MVar6 = findSuperclass((InterfaceSchema *)&local_88,(uint64_t)&local_c0,counter);
          aVar3 = MVar6.ptr.field_1;
          if ((char)local_88.segment == '\x01') {
            pRVar2 = (RawBrandedSchema *)CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
            goto LAB_001d369e;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    findSuperclass();
    aVar3 = extraout_RDX_00;
  }
  MVar6.ptr.field_1 = aVar3;
  MVar6.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar6.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_MAYBE(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return *result;
    }
  }

  return nullptr;
}